

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall Tokenizer::nextToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  Mark *pMVar3;
  runtime_error *this_00;
  undefined1 local_81;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_80;
  string local_78;
  undefined1 local_58 [24];
  undefined1 local_40 [16];
  byte local_30;
  Mark local_28;
  
  cVar1 = Stream::peek(&this->stream_);
  if (cVar1 == -1) {
    pMVar3 = Stream::getMark(&this->stream_);
    local_58._0_4_ = EOT;
    local_58._8_8_ = local_40;
    local_58._16_8_ = 0;
    local_40[0] = '\0';
    local_30 = 0;
    local_28 = *pMVar3;
    (this->token_).type = EOT;
    local_80 = &(this->token_).value;
    std::operator=(&local_80,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                    *)(local_58 + 8),&local_81);
    (this->token_).mark = local_28;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_30]._M_data)
              ((anon_class_1_0_00000001 *)&local_80,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)(local_58 + 8));
  }
  else {
    do {
      do {
        bVar2 = tryToSkipSpaces(this);
      } while (bVar2);
      bVar2 = tryToSkipComments(this);
    } while (bVar2);
    bVar2 = tryToGetKeywordOrIdentifier(this);
    if (!bVar2) {
      bVar2 = tryToGetString(this);
      if (!bVar2) {
        bVar2 = tryToGetNumber(this);
        if (!bVar2) {
          bVar2 = tryToGetSingleCharToken(this);
          if (!bVar2) {
            bVar2 = tryToGetCompoundToken(this);
            if (!bVar2) {
              cVar1 = Stream::peek(&this->stream_);
              if (cVar1 != -1) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78,"Unexpected character!","");
                makeErrorMessage((string *)local_58,this,&local_78);
                std::runtime_error::runtime_error(this_00,(string *)local_58);
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pMVar3 = Stream::getMark(&this->stream_);
              local_58._8_8_ = local_40;
              local_58._0_4_ = EOT;
              local_58._16_8_ = 0;
              local_40[0] = '\0';
              local_30 = 0;
              local_28 = *pMVar3;
              Token::operator=(&this->token_,(Token *)local_58);
              Token::~Token((Token *)local_58);
            }
          }
        }
      }
    }
  }
  __return_storage_ptr__->type = (this->token_).type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&__return_storage_ptr__->value,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&(this->token_).value);
  __return_storage_ptr__->mark = (this->token_).mark;
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::nextToken()
{
  if(stream_.peek() != EOF)
  {
    while(tryToSkipSpaces() || tryToSkipComments());

    if(tryToGetKeywordOrIdentifier())
      return token_;
    else if(tryToGetString())
      return token_;
    else if(tryToGetNumber())
      return token_;
    else if(tryToGetSingleCharToken())
      return token_;
    else if(tryToGetCompoundToken())
      return token_;
    else if(stream_.peek() == EOF)
      token_ = Token{stream_.getMark()};
    else
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    token_ = Token{stream_.getMark()};

  return token_;
}